

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2sAnalyzer.cpp
# Opt level: O3

void __thiscall I2sAnalyzer::SetupForGettingFirstFrame(I2sAnalyzer *this)

{
  GetNextBit(this,&this->mLastData,&this->mLastFrame,&this->mLastSample);
  while( true ) {
    GetNextBit(this,&this->mCurrentData,&this->mCurrentFrame,&this->mCurrentSample);
    if ((this->mCurrentFrame == BIT_HIGH) && (this->mLastFrame == BIT_LOW)) break;
    this->mLastFrame = this->mCurrentFrame;
    this->mLastData = this->mCurrentData;
    this->mLastSample = this->mCurrentSample;
  }
  if (((this->mSettings)._M_ptr)->mBitAlignment != BITS_SHIFTED_RIGHT_1) {
    return;
  }
  this->mLastFrame = BIT_HIGH;
  this->mLastData = this->mCurrentData;
  this->mLastSample = this->mCurrentSample;
  GetNextBit(this,&this->mCurrentData,&this->mCurrentFrame,&this->mCurrentSample);
  return;
}

Assistant:

void I2sAnalyzer::SetupForGettingFirstFrame()
{
    GetNextBit( mLastData, mLastFrame, mLastSample ); // we have to throw away one bit to get enough history on the FRAME line.

    for( ;; )
    {
        GetNextBit( mCurrentData, mCurrentFrame, mCurrentSample );

        if( mCurrentFrame == BIT_HIGH && mLastFrame == BIT_LOW )
        {
            if( mSettings->mBitAlignment == BITS_SHIFTED_RIGHT_1 )
            {
                // we need to advance to the next bit past the frame.
                mLastFrame = mCurrentFrame;
                mLastData = mCurrentData;
                mLastSample = mCurrentSample;

                GetNextBit( mCurrentData, mCurrentFrame, mCurrentSample );
            }
            return;
        }

        mLastFrame = mCurrentFrame;
        mLastData = mCurrentData;
        mLastSample = mCurrentSample;
    }
}